

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pageInsertArray(MemPage *pPg,u8 *pBegin,u8 **ppData,u8 *pCellptr,int iFirst,int nCell,
                   CellArray *pCArray)

{
  u8 *puVar1;
  u8 *__src;
  int iVar2;
  u8 *__dest;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  ushort uVar7;
  u8 *puVar8;
  int rc;
  int local_74;
  u8 *local_70;
  ushort *local_58;
  int local_34;
  
  if (0 < nCell) {
    puVar1 = pPg->aData;
    local_70 = *ppData;
    iVar6 = nCell + iFirst;
    uVar5 = 0;
    do {
      uVar3 = uVar5;
      if (5 < uVar3) break;
      uVar5 = uVar3 + 1;
    } while (pCArray->ixNx[uVar3] <= iFirst);
    local_74 = (int)(uVar3 + 1) + -1;
    puVar8 = pCArray->apEnd[uVar3];
    local_58 = (ushort *)pCellptr;
    do {
      uVar5 = (ulong)pCArray->szCell[iFirst];
      if (((puVar1[1] == '\0') && (puVar1[2] == '\0')) ||
         (__dest = pageFindSlot(pPg,(uint)pCArray->szCell[iFirst],&local_34), __dest == (u8 *)0x0))
      {
        iVar2 = 1;
        if ((long)uVar5 <= (long)local_70 - (long)pBegin) {
          __dest = local_70 + -uVar5;
          local_70 = __dest;
          goto LAB_0014ad14;
        }
      }
      else {
LAB_0014ad14:
        __src = pCArray->apCell[iFirst];
        if ((__src < puVar8) && (puVar8 < __src + uVar5)) {
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12224,
                      "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
          iVar2 = 1;
        }
        else {
          memmove(__dest,__src,uVar5);
          uVar7 = (short)__dest - (short)puVar1;
          *local_58 = uVar7 * 0x100 | uVar7 >> 8;
          local_58 = local_58 + 1;
          iFirst = iFirst + 1;
          iVar2 = 6;
          if (iFirst < iVar6) {
            lVar4 = (long)local_74;
            iVar2 = 0;
            if (pCArray->ixNx[lVar4] <= iFirst) {
              local_74 = local_74 + 1;
              puVar8 = pCArray->apEnd[lVar4 + 1];
            }
          }
        }
      }
    } while (iVar2 == 0);
    if (iVar2 != 6) {
      return 1;
    }
    *ppData = local_70;
  }
  return 0;
}

Assistant:

static int pageInsertArray(
  MemPage *pPg,                   /* Page to add cells to */
  u8 *pBegin,                     /* End of cell-pointer array */
  u8 **ppData,                    /* IN/OUT: Page content-area pointer */
  u8 *pCellptr,                   /* Pointer to cell-pointer area */
  int iFirst,                     /* Index of first cell to add */
  int nCell,                      /* Number of cells to add to pPg */
  CellArray *pCArray              /* Array of cells */
){
  int i = iFirst;                 /* Loop counter - cell index to insert */
  u8 *aData = pPg->aData;         /* Complete page */
  u8 *pData = *ppData;            /* Content area.  A subset of aData[] */
  int iEnd = iFirst + nCell;      /* End of loop. One past last cell to ins */
  int k;                          /* Current slot in pCArray->apEnd[] */
  u8 *pEnd;                       /* Maximum extent of cell data */
  assert( CORRUPT_DB || pPg->hdrOffset==0 );    /* Never called on page 1 */
  if( iEnd<=iFirst ) return 0;
  for(k=0; pCArray->ixNx[k]<=i && ALWAYS(k<NB*2); k++){}
  pEnd = pCArray->apEnd[k];
  while( 1 /*Exit by break*/ ){
    int sz, rc;
    u8 *pSlot;
    assert( pCArray->szCell[i]!=0 );
    sz = pCArray->szCell[i];
    if( (aData[1]==0 && aData[2]==0) || (pSlot = pageFindSlot(pPg,sz,&rc))==0 ){
      if( (pData - pBegin)<sz ) return 1;
      pData -= sz;
      pSlot = pData;
    }
    /* pSlot and pCArray->apCell[i] will never overlap on a well-formed
    ** database.  But they might for a corrupt database.  Hence use memmove()
    ** since memcpy() sends SIGABORT with overlapping buffers on OpenBSD */
    assert( (pSlot+sz)<=pCArray->apCell[i]
         || pSlot>=(pCArray->apCell[i]+sz)
         || CORRUPT_DB );
    if( (uptr)(pCArray->apCell[i]+sz)>(uptr)pEnd
     && (uptr)(pCArray->apCell[i])<(uptr)pEnd
    ){
      assert( CORRUPT_DB );
      (void)SQLITE_CORRUPT_BKPT;
      return 1;
    }
    memmove(pSlot, pCArray->apCell[i], sz);
    put2byte(pCellptr, (pSlot - aData));
    pCellptr += 2;
    i++;
    if( i>=iEnd ) break;
    if( pCArray->ixNx[k]<=i ){
      k++;
      pEnd = pCArray->apEnd[k];
    }
  }
  *ppData = pData;
  return 0;
}